

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itread.c
# Opt level: O0

int decompress8(DUMBFILE *f,char *data,int len,int it215,int stereo)

{
  byte bVar1;
  char cVar2;
  int iVar3;
  uint uVar4;
  int in_ECX;
  int in_EDX;
  char *in_RSI;
  int in_R8D;
  byte shift;
  char v;
  byte border;
  readblock_crap crap;
  char d2;
  char d1;
  word val;
  byte bitwidth;
  int blockpos;
  int blocklen;
  undefined4 in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff94;
  uint in_stack_ffffffffffffff98;
  uint in_stack_ffffffffffffff9c;
  int local_60;
  char local_5a;
  readblock_crap local_58;
  char local_32;
  char local_31;
  ushort local_30;
  byte local_2d;
  int local_2c;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  char *local_18;
  
  local_24 = in_R8D;
  local_20 = in_ECX;
  local_1c = in_EDX;
  local_18 = in_RSI;
  memset(&local_58,0,0x20);
  local_2c = 0;
  for (local_28 = 0; local_28 < local_1c; local_28 = local_28 + 1) {
    local_18[local_2c] = '\0';
    local_2c = local_24 + 1 + local_2c;
  }
  do {
    if (local_1c < 1) {
      return 0;
    }
    iVar3 = readblock((DUMBFILE *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                      (readblock_crap *)
                      CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
    if (iVar3 != 0) {
      return -1;
    }
    if (local_1c < 0x8000) {
      local_60 = local_1c;
    }
    else {
      local_60 = 0x8000;
    }
    local_28 = local_60;
    local_2c = 0;
    local_2d = 9;
    local_32 = '\0';
    local_31 = '\0';
    while (local_2c < local_28) {
      uVar4 = readbits((uint)local_2d,&local_58);
      local_30 = (ushort)uVar4;
      local_5a = (char)uVar4;
      if (local_2d < 7) {
        if ((uVar4 & 0xffff) == 1 << (local_2d - 1 & 0x1f)) {
          iVar3 = readbits(3,&local_58);
          local_30 = (short)iVar3 + 1;
          if (local_30 < local_2d) {
            in_stack_ffffffffffffff9c = (uint)local_30;
          }
          else {
            in_stack_ffffffffffffff9c = local_30 + 1;
          }
          local_2d = (byte)in_stack_ffffffffffffff9c;
        }
        else {
LAB_009c1f57:
          if (local_2d < 8) {
            local_5a = (char)((int)(char)(local_5a << (8 - local_2d & 0x1f)) >>
                             (8 - local_2d & 0x1f));
          }
          local_31 = local_31 + local_5a;
          local_32 = local_32 + local_31;
          cVar2 = local_31;
          if (local_20 != 0) {
            cVar2 = local_32;
          }
          in_stack_ffffffffffffff94 = (int)cVar2;
          *local_18 = cVar2;
          local_18 = local_18 + (long)local_24 + 1;
          local_1c = local_1c + -1;
          local_2c = local_2c + 1;
        }
      }
      else if (local_2d < 9) {
        bVar1 = (char)(0xff >> (9 - local_2d & 0x1f)) - 4;
        if (((uVar4 & 0xffff) <= (uint)bVar1) || (bVar1 + 8 < (uVar4 & 0xffff))) goto LAB_009c1f57;
        local_30 = local_30 - bVar1;
        if (local_30 < local_2d) {
          in_stack_ffffffffffffff98 = (uint)local_30;
        }
        else {
          in_stack_ffffffffffffff98 = local_30 + 1;
        }
        local_2d = (byte)in_stack_ffffffffffffff98;
      }
      else {
        if (local_2d != 9) {
          freeblock((readblock_crap *)0x9c1f46);
          return -1;
        }
        if ((uVar4 & 0x100) == 0) goto LAB_009c1f57;
        local_2d = local_5a + 1;
      }
    }
    freeblock((readblock_crap *)0x9c2029);
  } while( true );
}

Assistant:

static int decompress8(DUMBFILE *f, signed char *data, int len, int it215, int stereo)
{
	int blocklen, blockpos;
	byte bitwidth;
	word val;
	char d1, d2;
	readblock_crap crap;

	memset(&crap, 0, sizeof(crap));

	for (blocklen = 0, blockpos = 0; blocklen < len; blocklen++, blockpos += 1 + stereo)
		data[ blockpos ] = 0;

	while (len > 0) {
		//Read a block of compressed data:
		if (readblock(f, &crap))
			return -1;
		//Set up a few variables
		blocklen = (len < 0x8000) ? len : 0x8000; //Max block length is 0x8000 bytes
		blockpos = 0;
		bitwidth = 9;
		d1 = d2 = 0;
		//Start the decompression:
		while (blockpos < blocklen) {
			//Read a value:
			val = (word)readbits(bitwidth, &crap);
			//Check for bit width change:

			if (bitwidth < 7) { //Method 1:
				if (val == (1 << (bitwidth - 1))) {
					val = (word)readbits(3, &crap) + 1;
					bitwidth = (val < bitwidth) ? val : val + 1;
					continue;
				}
			}
			else if (bitwidth < 9) { //Method 2
				byte border = (0xFF >> (9 - bitwidth)) - 4;

				if (val > border && val <= (border + 8)) {
					val -= border;
					bitwidth = (val < bitwidth) ? val : val + 1;
					continue;
				}
			}
			else if (bitwidth == 9) { //Method 3
				if (val & 0x100) {
					bitwidth = (val + 1) & 0xFF;
					continue;
				}
			}
			else { //Illegal width, abort ?
				freeblock(&crap);
				return -1;
			}

			//Expand the value to signed byte:
			{
				char v; //The sample value:
				if (bitwidth < 8) {
					byte shift = 8 - bitwidth;
					v = (val << shift);
					v >>= shift;
				}
				else
					v = (char)val;

				//And integrate the sample value
				//(It always has to end with integration doesn't it ? ;-)
				d1 += v;
				d2 += d1;
			}

			//Store !
			/* Version 2.15 was an unofficial version with hacked compression
			 * code. Yay, better compression :D
			 */
			*data++ = it215 ? d2 : d1;
			data += stereo;
			len--;
			blockpos++;
		}
		freeblock(&crap);
	}
	return 0;
}